

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O0

LY_ERR json_print_opaq(jsonpr_ctx *pctx,lyd_node_opaq *node)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  LY_ERR LVar4;
  char *pcVar5;
  uint local_5c;
  uint local_44;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  uint32_t hints;
  ly_bool last;
  ly_bool first;
  lyd_node_opaq *node_local;
  jsonpr_ctx *pctx_local;
  
  bVar1 = true;
  bVar2 = true;
  if (node->hints == 0x3f3) {
    ret___1 = LY_SUCCESS;
  }
  else {
    ret___1 = node->hints;
  }
  if ((ret___1 & 0x180) != LY_SUCCESS) {
    if ((((node->field_0).node.prev)->next != (lyd_node *)0x0) &&
       (iVar3 = matching_node((node->field_0).node.prev,(lyd_node *)node), iVar3 != 0)) {
      bVar1 = false;
    }
    if (((node->field_0).node.next != (lyd_node *)0x0) &&
       (iVar3 = matching_node((lyd_node *)node,(node->field_0).node.next), iVar3 != 0)) {
      bVar2 = false;
    }
  }
  if (bVar1) {
    LVar4 = json_print_member2(pctx,pctx->parent,node->format,&node->name,'\0');
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
    if (((ret___1 & 0x180) != LY_SUCCESS) &&
       (LVar4 = json_print_array_open(pctx,(lyd_node *)node), LVar4 != LY_SUCCESS)) {
      return LVar4;
    }
    if ((ret___1 & 0x100) != LY_SUCCESS) {
      if ((pctx->options & 2) == 0) {
        local_44 = (uint)pctx->level << 1;
      }
      else {
        local_44 = 0;
      }
      ly_print_(pctx->out,"%*s",(ulong)local_44,"");
    }
  }
  else if ((ret___1 & 0x100) != LY_SUCCESS) {
    pcVar5 = "";
    if ((pctx->options & 2) == 0) {
      pcVar5 = "\n";
    }
    if ((pctx->options & 2) == 0) {
      local_5c = (uint)pctx->level << 1;
    }
    else {
      local_5c = 0;
    }
    ly_print_(pctx->out,",%s%*s",pcVar5,(ulong)local_5c,"");
  }
  if (((node->child == (lyd_node *)0x0) && ((ret___1 & LY_EPLUGIN) == LY_SUCCESS)) &&
     ((ret___1 & 0x200) == LY_SUCCESS)) {
    if ((ret___1 & 0x40) == LY_SUCCESS) {
      if (((ret___1 & 0x22) == LY_SUCCESS) || ((ret___1 & 0x10) != LY_SUCCESS)) {
        json_print_string(pctx->out,node->value);
      }
      else {
        ly_print_(pctx->out,"%s",node->value);
      }
    }
    else {
      ly_print_(pctx->out,"[null]");
    }
    pctx->level_printed = pctx->level;
    if ((ret___1 & 0x100) == LY_SUCCESS) {
      json_print_attributes(pctx,(lyd_node *)node,'\0');
    }
    else if ((pctx->first_leaflist == (lyd_node *)0x0) && (node->attr != (lyd_attr *)0x0)) {
      pctx->first_leaflist = (lyd_node *)node;
    }
  }
  else {
    LVar4 = json_print_inner(pctx,(lyd_node *)node);
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
    pctx->level_printed = pctx->level;
  }
  if ((bVar2) && ((ret___1 & 0x180) != LY_SUCCESS)) {
    json_print_array_close(pctx);
    pctx->level_printed = pctx->level;
  }
  return LY_SUCCESS;
}

Assistant:

static LY_ERR
json_print_opaq(struct jsonpr_ctx *pctx, const struct lyd_node_opaq *node)
{
    ly_bool first = 1, last = 1;
    uint32_t hints;

    if (node->hints == LYD_HINT_DATA) {
        /* useless and confusing hints */
        hints = 0;
    } else {
        hints = node->hints;
    }

    if (hints & (LYD_NODEHINT_LIST | LYD_NODEHINT_LEAFLIST)) {
        if (node->prev->next && matching_node(node->prev, &node->node)) {
            first = 0;
        }
        if (node->next && matching_node(&node->node, node->next)) {
            last = 0;
        }
    }

    if (first) {
        LY_CHECK_RET(json_print_member2(pctx, pctx->parent, node->format, &node->name, 0));

        if (hints & (LYD_NODEHINT_LIST | LYD_NODEHINT_LEAFLIST)) {
            LY_CHECK_RET(json_print_array_open(pctx, &node->node));
        }
        if (hints & LYD_NODEHINT_LEAFLIST) {
            ly_print_(pctx->out, "%*s", INDENT);
        }
    } else if (hints & LYD_NODEHINT_LEAFLIST) {
        ly_print_(pctx->out, ",%s%*s", DO_FORMAT ? "\n" : "", INDENT);
    }
    if (node->child || (hints & LYD_NODEHINT_LIST) || (hints & LYD_NODEHINT_CONTAINER)) {
        LY_CHECK_RET(json_print_inner(pctx, &node->node));
        LEVEL_PRINTED;
    } else {
        if (hints & LYD_VALHINT_EMPTY) {
            ly_print_(pctx->out, "[null]");
        } else if ((hints & (LYD_VALHINT_BOOLEAN | LYD_VALHINT_DECNUM)) && !(hints & LYD_VALHINT_NUM64)) {
            ly_print_(pctx->out, "%s", node->value);
        } else {
            /* string or a large number */
            json_print_string(pctx->out, node->value);
        }
        LEVEL_PRINTED;

        if (!(hints & LYD_NODEHINT_LEAFLIST)) {
            /* attributes */
            json_print_attributes(pctx, (const struct lyd_node *)node, 0);
        } else if (!pctx->first_leaflist && node->attr) {
            /* attributes printed later */
            pctx->first_leaflist = &node->node;
        }

    }
    if (last && (hints & (LYD_NODEHINT_LIST | LYD_NODEHINT_LEAFLIST))) {
        json_print_array_close(pctx);
        LEVEL_PRINTED;
    }

    return LY_SUCCESS;
}